

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

vector<Card,_std::allocator<Card>_> * __thiscall
Game::getValidCards(vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Game *this,
                   size_t playerID,Card *c)

{
  pointer *ppCVar1;
  pointer pvVar2;
  Card *pCVar3;
  iterator __position;
  bool bVar4;
  undefined8 uVar5;
  ulong uVar6;
  Card *pCVar7;
  undefined8 *unaff_R14;
  Card card;
  Card local_38;
  
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = (this->m_playerCards).
           super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->m_playerCards).
                 super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  if (playerID <= uVar6 && uVar6 - playerID != 0) {
    pCVar3 = *(pointer *)
              ((long)&pvVar2[playerID].super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (pCVar7 = pvVar2[playerID].super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar7 != pCVar3; pCVar7 = pCVar7 + 1) {
      local_38 = *pCVar7;
      bVar4 = checkValidCard(this,playerID,*c,local_38);
      if (bVar4) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                    ((vector<Card,std::allocator<Card>> *)__return_storage_ptr__,__position,
                     &local_38);
        }
        else {
          *__position._M_current = local_38;
          ppCVar1 = &(__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
      }
    }
    return __return_storage_ptr__;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     playerID);
  if ((void *)*unaff_R14 != (void *)0x0) {
    operator_delete((void *)*unaff_R14);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

std::vector<Card> Game::getValidCards(size_t playerID, Card &c) {
    std::vector<Card> validCards = std::vector<Card>();
    for (Card card : m_playerCards.at(playerID)) {
        if (checkValidCard(playerID, c, card))
            validCards.push_back(card);
    }
    return validCards;
}